

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall tinyusdz::Path::is_root_prim(Path *this)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  Path *this_local;
  
  if ((this->_valid & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = is_root_path(this);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      uVar2 = ::std::__cxx11::string::size();
      if (((uVar2 < 2) ||
          (pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)this), *pcVar3 != '/')) ||
         (lVar4 = ::std::__cxx11::string::find_last_of((char)this,0x2f), lVar4 != 0)) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool is_root_prim() const {
    if (!_valid) {
      return false;
    }

    if (is_root_path()) {
      return false;
    }

    if ((_prim_part.size() > 1) && (_prim_part[0] == '/')) {
      // no other '/' except for the fist one
      if (_prim_part.find_last_of('/') == 0) {
        return true;
      }
    }

    return false;
  }